

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

bool __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>::Set
          (AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
           *this,AuxPointerType e,void *p)

{
  AuxPointerType AVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->count != '\x01') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0x67,"(count == _MaxCount)","count == _MaxCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  AVar1 = this->type[0];
  if (AVar1 == Invalid || AVar1 == e) {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(this->ptr,p);
    this->type[0] = e;
  }
  return AVar1 == Invalid || AVar1 == e;
}

Assistant:

inline bool AuxPtrsFix<FieldsEnum, size, _MaxCount>::Set(FieldsEnum e, void* p)
    {
        Assert(count == _MaxCount);
        for (uint8 i = 0; i < _MaxCount; i++)
        {
            if ((FieldsEnum) type[i] == e || (FieldsEnum) type[i] == FieldsEnum::Invalid)
            {
                ptr[i] = p;
                type[i] = e;
                return true;
            }
        }
        return false;
    }